

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS
ref_part_meshb_cell(REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_LONG nnode,
                   REF_INT version,REF_BOOL pad,FILE *file)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  REF_MPI ref_mpi;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  int iVar7;
  ulong uVar8;
  REF_GLOB *pRVar9;
  REF_INT *pRVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  long *plVar15;
  void *pvVar16;
  long lVar17;
  int *piVar18;
  undefined8 uVar19;
  ulong uVar20;
  size_t sVar21;
  void *pvVar22;
  int *data;
  size_t __n;
  long lVar23;
  char *pcVar24;
  REF_INT *pRVar25;
  REF_GLOB *__ptr;
  long lVar26;
  uint uVar27;
  size_t sVar28;
  ulong local_140;
  REF_INT elements_to_receive;
  long *local_128;
  ulong local_120;
  ulong local_118;
  long local_110;
  undefined4 *local_108;
  ulong local_100;
  long local_f8;
  void *local_f0;
  int *local_e8;
  void *local_e0;
  REF_CELL local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  REF_INT *local_b8;
  REF_NODE local_b0;
  REF_INT local_a8;
  REF_INT end_of_message;
  ulong local_a0;
  void *local_98;
  long local_90;
  long local_88;
  long local_80;
  REF_GLOB *local_78;
  REF_INT *local_70;
  long local_68;
  long *local_60;
  int *local_58;
  int *local_50;
  long local_48;
  long local_40;
  REF_INT zero;
  
  ref_mpi = ref_node->ref_mpi;
  end_of_message = -1;
  iVar7 = ref_mpi->n;
  uVar8 = ncell / (long)iVar7;
  uVar11 = 1000000;
  if (1000000 < (long)uVar8) {
    uVar11 = uVar8;
  }
  uVar5 = ref_cell->size_per;
  lVar26 = (long)(int)uVar5;
  uVar4 = uVar5 * (int)uVar11;
  local_f8 = nnode;
  local_b0 = ref_node;
  if ((int)uVar4 < 0) {
    pcVar24 = "malloc sent_c2n of REF_GLOB negative";
    uVar19 = 0x1b4;
LAB_0020449d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
           "ref_part_meshb_cell",pcVar24);
LAB_002044a4:
    RVar6 = 1;
  }
  else {
    local_b8 = (REF_INT *)CONCAT44(local_b8._4_4_,pad);
    uVar1 = ref_cell->node_per;
    __n = (size_t)(int)uVar1;
    sVar28 = (ulong)uVar4 << 3;
    local_d8 = ref_cell;
    local_d0 = ncell;
    local_c8 = uVar11;
    local_a8 = version;
    pRVar9 = (REF_GLOB *)malloc(sVar28);
    if (pRVar9 == (REF_GLOB *)0x0) {
      pcVar24 = "malloc sent_c2n of REF_GLOB NULL";
      uVar19 = 0x1b4;
    }
    else {
      local_80 = lVar26;
      local_78 = pRVar9;
      if (ref_mpi->id != 0) {
        lVar17 = local_f8 + -1;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        local_120 = lVar26 * 8;
        local_c8 = lVar26 * 4;
        do {
          uVar5 = ref_mpi_scatter_recv(ref_mpi,&elements_to_receive,1,1);
          if (uVar5 != 0) {
            pcVar24 = "recv";
            uVar19 = 0x23f;
            goto LAB_00204caf;
          }
          __ptr = pRVar9;
          if (0 < elements_to_receive) {
            uVar5 = ref_mpi_scatter_recv(ref_mpi,pRVar9,elements_to_receive * (int)lVar26,2);
            if (uVar5 != 0) {
              pcVar24 = "send";
              uVar19 = 0x243;
              goto LAB_00204caf;
            }
            local_d0 = CONCAT44(local_d0._4_4_,elements_to_receive);
            uVar5 = elements_to_receive * (int)lVar26;
            if ((int)uVar5 < 0) {
              pcVar24 = "malloc sent_part of REF_INT negative";
              uVar19 = 0x246;
              goto LAB_0020449d;
            }
            pRVar10 = (REF_INT *)malloc((ulong)uVar5 * 4);
            __ptr = local_78;
            if (pRVar10 == (REF_INT *)0x0) {
              pcVar24 = "malloc sent_part of REF_INT NULL";
              uVar19 = 0x246;
              goto LAB_002044c9;
            }
            for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
              pRVar10[uVar11] = -1;
            }
            local_100 = 0;
            if (0 < (int)local_d0) {
              local_100 = local_d0 & 0xffffffff;
            }
            pRVar25 = pRVar10;
            for (uVar11 = 0; uVar11 != local_100; uVar11 = uVar11 + 1) {
              for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
                lVar23 = (long)ref_mpi->n;
                lVar26 = (lVar17 + lVar23) / lVar23;
                lVar12 = pRVar9[uVar8] / lVar26;
                lVar13 = lVar17 / lVar23;
                lVar23 = local_f8 - lVar23 * lVar13;
                if (lVar23 <= lVar12) {
                  lVar12 = (pRVar9[uVar8] - lVar26 * lVar23) / lVar13 + lVar23;
                }
                pRVar25[uVar8] = (REF_INT)lVar12;
              }
              pRVar9 = (REF_GLOB *)((long)pRVar9 + local_120);
              pRVar25 = (REF_INT *)((long)pRVar25 + local_c8);
            }
            local_b8 = pRVar10;
            uVar5 = ref_cell_add_many_global
                              (local_d8,local_b0,(int)local_d0,local_78,pRVar10,ref_mpi->id);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x250,"ref_part_meshb_cell",(ulong)uVar5,"many glob");
              return uVar5;
            }
            free(pRVar10);
            lVar26 = local_80;
          }
          pRVar9 = __ptr;
        } while (elements_to_receive != -1);
LAB_0020442f:
        free(__ptr);
        uVar5 = ref_migrate_shufflin_cell(local_b0,local_d8);
        if (uVar5 == 0) {
          return 0;
        }
        pcVar24 = "fill ghosts";
        uVar19 = 0x259;
LAB_00204caf:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar19,"ref_part_meshb_cell",(ulong)uVar5,pcVar24);
        return uVar5;
      }
      if (iVar7 < 0) {
        pcVar24 = "malloc elements_to_send of REF_INT negative";
        uVar19 = 0x1b7;
        goto LAB_0020449d;
      }
      sVar21 = (long)iVar7 << 2;
      piVar14 = (int *)malloc(sVar21);
      if (piVar14 == (int *)0x0) {
        pcVar24 = "malloc elements_to_send of REF_INT NULL";
        uVar19 = 0x1b7;
      }
      else {
        local_e8 = piVar14;
        local_108 = (undefined4 *)malloc(sVar21);
        if (local_108 == (undefined4 *)0x0) {
          pcVar24 = "malloc start_to_send of REF_INT NULL";
          uVar19 = 0x1b8;
        }
        else {
          plVar15 = (long *)malloc(sVar28);
          if (plVar15 == (long *)0x0) {
            pcVar24 = "malloc c2n of REF_GLOB NULL";
            uVar19 = 0x1b9;
          }
          else {
            local_88 = __n + 1;
            uVar27 = (uint)local_c8;
            uVar4 = (int)local_88 * uVar27;
            if ((int)uVar4 < 0) {
              pcVar24 = "malloc c2n_int of REF_INT negative";
              uVar19 = 0x1ba;
              goto LAB_0020449d;
            }
            local_128 = plVar15;
            pvVar16 = malloc((ulong)uVar4 * 4);
            if (pvVar16 == (void *)0x0) {
              pcVar24 = "malloc c2n_int of REF_INT NULL";
              uVar19 = 0x1ba;
            }
            else {
              local_f0 = pvVar16;
              pvVar16 = malloc((ulong)uVar4 << 3);
              if (pvVar16 == (void *)0x0) {
                pcVar24 = "malloc c2n_long of REF_LONG NULL";
                uVar19 = 0x1bb;
              }
              else {
                if ((int)uVar27 < 0) {
                  pcVar24 = "malloc dest of REF_INT negative";
                  uVar19 = 0x1bc;
                  goto LAB_0020449d;
                }
                local_98 = pvVar16;
                local_e0 = malloc((ulong)(uVar27 & 0x7fffffff) << 2);
                if (local_e0 != (void *)0x0) {
                  local_100 = local_f8 - 1;
                  uVar11 = 0;
                  if (0 < (int)uVar5) {
                    uVar11 = (ulong)uVar5;
                  }
                  local_120 = 0;
                  if (0 < (int)uVar1) {
                    local_120 = (ulong)uVar1;
                  }
                  local_48 = __n * 4;
                  local_c0 = local_88 * 4;
                  local_110 = lVar26 * 8;
                  local_68 = local_88 << 3;
                  local_60 = local_128 + 3;
                  local_40 = lVar26 * 4;
                  local_50 = local_108 + 1;
                  local_58 = local_e8 + 1;
                  lVar17 = 0;
                  piVar14 = local_e8;
                  __ptr = pRVar9;
                  local_a0 = uVar11;
                  while (pvVar22 = local_98, pvVar16 = local_f0, lVar17 < (long)local_d0) {
                    uVar5 = (int)local_d0 - (int)lVar17;
                    uVar8 = (ulong)uVar5;
                    if ((int)local_c8 < (int)uVar5) {
                      uVar8 = local_c8 & 0xffffffff;
                    }
                    iVar7 = (int)uVar8;
                    local_118 = CONCAT44(local_118._4_4_,iVar7);
                    local_90 = lVar17;
                    if ((int)local_b8 == 0) {
                      sVar28 = (size_t)(iVar7 * (int)local_88);
                      if (local_a8 < 4) {
                        sVar21 = fread(local_f0,4,sVar28,(FILE *)file);
                        if (sVar21 != sVar28) {
                          pcVar24 = "int c2n";
                          uVar19 = 0x1d5;
LAB_00204ef4:
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,uVar19,"ref_part_meshb_cell",pcVar24,sVar28,sVar21);
                          goto LAB_002044a4;
                        }
                        local_140 = 0;
                        if (0 < (int)local_118) {
                          local_140 = local_118 & 0xffffffff;
                        }
                        plVar15 = local_128;
                        for (uVar8 = 0; uVar8 != local_140; uVar8 = uVar8 + 1) {
                          for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
                            plVar15[uVar20] = (long)*(int *)((long)pvVar16 + uVar20 * 4);
                          }
                          plVar15 = (long *)((long)plVar15 + local_110);
                          pvVar16 = (void *)((long)pvVar16 + local_c0);
                        }
                      }
                      else {
                        sVar21 = fread(local_98,8,sVar28,(FILE *)file);
                        if (sVar21 != sVar28) {
                          pcVar24 = "long c2n";
                          uVar19 = 0x1dc;
                          goto LAB_00204ef4;
                        }
                        local_140 = 0;
                        if (0 < (int)local_118) {
                          local_140 = local_118 & 0xffffffff;
                        }
                        plVar15 = local_128;
                        for (uVar8 = 0; uVar8 != local_140; uVar8 = uVar8 + 1) {
                          for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
                            plVar15[uVar20] = *(long *)((long)pvVar22 + uVar20 * 8);
                          }
                          plVar15 = (long *)((long)plVar15 + local_110);
                          pvVar22 = (void *)((long)pvVar22 + local_68);
                        }
                      }
                    }
                    else {
                      uVar11 = 0;
                      local_140 = 0;
                      if (0 < iVar7) {
                        uVar11 = uVar8;
                        local_140 = uVar8;
                      }
                      while (uVar11 != 0) {
                        sVar21 = fread(pvVar16,4,__n,(FILE *)file);
                        if (sVar21 != __n) {
                          pcVar24 = "int c2n pad node";
                          uVar19 = 0x1c8;
                          sVar28 = __n;
                          goto LAB_00204ef4;
                        }
                        sVar21 = fread(&zero,4,1,(FILE *)file);
                        if (sVar21 != 1) {
                          pcVar24 = "int c2n pad zero";
                          uVar19 = 0x1c9;
                          sVar28 = 1;
                          goto LAB_00204ef4;
                        }
                        sVar21 = fread((void *)((long)pvVar16 + local_48),4,1,(FILE *)file);
                        if (sVar21 != 1) {
                          pcVar24 = "int c2n pad tag";
                          uVar19 = 0x1cd;
                          sVar28 = 1;
                          goto LAB_00204ef4;
                        }
                        uVar11 = uVar11 - 1;
                        pvVar16 = (void *)((long)pvVar16 + local_c0);
                      }
                      pvVar16 = local_f0;
                      plVar15 = local_128;
                      for (uVar8 = 0; uVar11 = local_a0, uVar8 != local_140; uVar8 = uVar8 + 1) {
                        for (uVar11 = 0; local_a0 != uVar11; uVar11 = uVar11 + 1) {
                          plVar15[uVar11] = (long)*(int *)((long)pvVar16 + uVar11 * 4);
                        }
                        plVar15 = (long *)((long)plVar15 + local_110);
                        pvVar16 = (void *)((long)pvVar16 + local_c0);
                      }
                    }
                    plVar15 = local_128;
                    for (uVar8 = 0; uVar8 != local_140; uVar8 = uVar8 + 1) {
                      for (uVar20 = 0; local_120 != uVar20; uVar20 = uVar20 + 1) {
                        plVar15[uVar20] = plVar15[uVar20] + -1;
                      }
                      plVar15 = (long *)((long)plVar15 + local_110);
                    }
                    plVar15 = local_60;
                    uVar8 = local_140;
                    if (local_d8->type == REF_CELL_PYR) {
                      while (uVar8 != 0) {
                        lVar17 = *plVar15;
                        lVar12 = plVar15[1];
                        *plVar15 = plVar15[-2];
                        plVar15[1] = plVar15[-1];
                        plVar15[-2] = lVar17;
                        plVar15[-1] = lVar12;
                        plVar15 = (long *)((long)plVar15 + local_110);
                        uVar8 = uVar8 - 1;
                      }
                    }
                    local_118 = (ulong)(int)local_118;
                    plVar15 = local_128;
                    for (uVar8 = 0; local_140 != uVar8; uVar8 = uVar8 + 1) {
                      lVar13 = (long)ref_mpi->n;
                      lVar17 = (long)(local_100 + lVar13) / lVar13;
                      lVar12 = *plVar15 / lVar17;
                      lVar23 = local_f8 - lVar13 * ((long)local_100 / lVar13);
                      if (lVar23 <= lVar12) {
                        lVar12 = (*plVar15 - lVar17 * lVar23) / ((long)local_100 / lVar13) + lVar23;
                      }
                      *(int *)((long)local_e0 + uVar8 * 4) = (int)lVar12;
                      plVar15 = (long *)((long)plVar15 + local_110);
                    }
                    lVar12 = (long)ref_mpi->n;
                    for (lVar17 = 0; lVar17 < lVar12; lVar17 = lVar17 + 1) {
                      local_e8[lVar17] = 0;
                    }
                    for (uVar8 = 0; local_140 != uVar8; uVar8 = uVar8 + 1) {
                      local_e8[*(int *)((long)local_e0 + uVar8 * 4)] =
                           local_e8[*(int *)((long)local_e0 + uVar8 * 4)] + 1;
                    }
                    *local_108 = 0;
                    iVar7 = 0;
                    for (lVar17 = 1; lVar17 < lVar12; lVar17 = lVar17 + 1) {
                      iVar7 = iVar7 + local_e8[lVar17 + -1];
                      local_108[lVar17] = iVar7;
                    }
                    for (lVar17 = 0; lVar17 < lVar12; lVar17 = lVar17 + 1) {
                      local_e8[lVar17] = 0;
                    }
                    plVar15 = local_128;
                    for (uVar8 = 0; uVar8 != local_140; uVar8 = uVar8 + 1) {
                      iVar7 = *(int *)((long)local_e0 + uVar8 * 4);
                      iVar2 = local_e8[iVar7];
                      iVar3 = local_108[iVar7];
                      for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
                        __ptr[(long)((iVar3 + iVar2) * (int)lVar26) + uVar20] = plVar15[uVar20];
                      }
                      local_e8[iVar7] = iVar2 + 1;
                      plVar15 = (long *)((long)plVar15 + local_110);
                    }
                    iVar7 = *local_e8;
                    pRVar9 = __ptr;
                    if (0 < (long)iVar7) {
                      uVar5 = iVar7 * (int)lVar26;
                      if ((int)uVar5 < 0) {
                        pcVar24 = "malloc sent_part of REF_INT negative";
                        uVar19 = 0x215;
                        goto LAB_0020449d;
                      }
                      pRVar10 = (REF_INT *)malloc((ulong)uVar5 * 4);
                      if (pRVar10 == (REF_INT *)0x0) {
                        pcVar24 = "malloc sent_part of REF_INT NULL";
                        uVar19 = 0x215;
                        goto LAB_002044c9;
                      }
                      for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
                        pRVar10[uVar11] = -1;
                      }
                      pRVar25 = pRVar10;
                      for (lVar17 = 0; lVar17 != iVar7; lVar17 = lVar17 + 1) {
                        for (uVar11 = 0; local_120 != uVar11; uVar11 = uVar11 + 1) {
                          lVar26 = (long)(local_100 + lVar12) / lVar12;
                          lVar13 = __ptr[uVar11] / lVar26;
                          lVar23 = local_f8 - ((long)local_100 / lVar12) * lVar12;
                          if (lVar23 <= lVar13) {
                            lVar13 = (__ptr[uVar11] - lVar26 * lVar23) / ((long)local_100 / lVar12)
                                     + lVar23;
                          }
                          pRVar25[uVar11] = (REF_INT)lVar13;
                          lVar26 = local_80;
                          pRVar9 = local_78;
                        }
                        __ptr = (REF_GLOB *)((long)__ptr + local_110);
                        pRVar25 = (REF_INT *)((long)pRVar25 + local_40);
                      }
                      local_70 = pRVar10;
                      uVar5 = ref_cell_add_many_global
                                        (local_d8,local_b0,iVar7,pRVar9,pRVar10,ref_mpi->id);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x21e,"ref_part_meshb_cell",(ulong)uVar5,"glob");
                        return uVar5;
                      }
                      free(pRVar10);
                      uVar11 = local_a0;
                    }
                    local_90 = local_90 + local_118;
                    piVar18 = local_50;
                    data = local_58;
                    piVar14 = local_e8;
                    for (lVar12 = 1; lVar17 = local_90, __ptr = pRVar9, lVar12 < ref_mpi->n;
                        lVar12 = lVar12 + 1) {
                      if (0 < *data) {
                        uVar5 = ref_mpi_scatter_send(ref_mpi,data,1,1,(REF_INT)lVar12);
                        if (uVar5 != 0) {
                          pcVar24 = "send";
                          uVar19 = 0x227;
                          goto LAB_00204caf;
                        }
                        uVar5 = ref_mpi_scatter_send
                                          (ref_mpi,pRVar9 + *piVar18 * lVar26,*data * (int)lVar26,2,
                                           (REF_INT)lVar12);
                        piVar14 = local_e8;
                        if (uVar5 != 0) {
                          pcVar24 = "send";
                          uVar19 = 0x22b;
                          goto LAB_00204caf;
                        }
                      }
                      piVar18 = piVar18 + 1;
                      data = data + 1;
                    }
                  }
                  free(local_e0);
                  free(local_98);
                  free(local_f0);
                  free(local_128);
                  free(local_108);
                  free(piVar14);
                  iVar7 = 1;
                  do {
                    if (ref_mpi->n <= iVar7) goto LAB_0020442f;
                    uVar5 = ref_mpi_scatter_send(ref_mpi,&end_of_message,1,1,iVar7);
                    iVar7 = iVar7 + 1;
                  } while (uVar5 == 0);
                  pcVar24 = "send";
                  uVar19 = 0x23a;
                  goto LAB_00204caf;
                }
                pcVar24 = "malloc dest of REF_INT NULL";
                uVar19 = 0x1bc;
              }
            }
          }
        }
      }
    }
LAB_002044c9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar19,
           "ref_part_meshb_cell",pcVar24);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell(REF_CELL ref_cell, REF_LONG ncell,
                                              REF_NODE ref_node, REF_LONG nnode,
                                              REF_INT version, REF_BOOL pad,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  node_per = ref_cell_node_per(ref_cell);
  size_per = ref_cell_size_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(c2n_int, (node_per + 1) * chunk, REF_INT);
    ref_malloc(c2n_long, (node_per + 1) * chunk, REF_LONG);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
      nread = (size_t)(section_size * (1 + node_per));
      if (pad) {
        for (cell = 0; cell < section_size; cell++) {
          REF_INT zero;
          REIS(node_per,
               fread(&(c2n_int[(node_per + 1) * cell]), sizeof(REF_INT),
                     (size_t)node_per, file),
               "int c2n pad node");
          REIS(1, fread(&(zero), sizeof(REF_INT), 1, file), "int c2n pad zero");
          REIS(1,
               fread(&(c2n_int[node_per + (node_per + 1) * cell]),
                     sizeof(REF_INT), 1, file),
               "int c2n pad tag");
        }
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        if (version < 4) {
          REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
        } else {
          REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file),
               "long c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
        }
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;

      if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
        REF_GLOB n0, n1, n2, n3, n4;
        /* convention: square basis is 0-1-2-3
           (oriented counter clockwise like trias) and top vertex is 4 */
        for (cell = 0; cell < section_size; cell++) {
          n0 = c2n[0 + size_per * cell];
          n1 = c2n[1 + size_per * cell];
          n2 = c2n[2 + size_per * cell];
          n3 = c2n[3 + size_per * cell];
          n4 = c2n[4 + size_per * cell];
          c2n[0 + size_per * cell] = n0;
          c2n[3 + size_per * cell] = n1;
          c2n[4 + size_per * cell] = n2;
          c2n[1 + size_per * cell] = n3;
          c2n[2 + size_per * cell] = n4;
        }
      }

      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      /* rank 0 keepers */

      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }

      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(c2n_long);
    ref_free(c2n_int);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (elements_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");

        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);

        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "many glob");

        ref_free(sent_part);
      }
    } while (elements_to_receive != end_of_message);
  }

  free(sent_c2n);

  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");

  return REF_SUCCESS;
}